

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugger_type.hpp
# Opt level: O0

void __thiscall debugger_type::debugger_type(debugger_type *this,int id,double param_2,char param_3)

{
  char param_3_local;
  double param_2_local;
  int id_local;
  debugger_type *this_local;
  
  this->id = id;
  this->from_ctor = false;
  this->from_move_ctor = false;
  this->from_copy_ctor = false;
  this->was_move_assigned = false;
  this->was_copy_assigned = false;
  this->swapped = false;
  this->from_ctor = true;
  return;
}

Assistant:

debugger_type(int id, double = 0., char = 0) : id(id)
    {
        from_ctor = true;
    }